

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O0

void __thiscall
UniversalTest_SingleUniversal_Test_Test::TestBody(UniversalTest_SingleUniversal_Test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  result_type rVar4;
  reference pvVar5;
  ostream *this_00;
  void *this_01;
  char *pcVar6;
  char *in_R9;
  string local_14b8;
  AssertHelper local_1498;
  Message local_1490;
  bool local_1481;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_1468 [4];
  int i_2;
  AssertHelper local_1448;
  Message local_1440;
  bool local_1431;
  undefined1 local_1430 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1418 [4];
  int i_1;
  FoolHeapList fool;
  HeapList tested;
  uint local_13d0;
  int type;
  int i;
  allocator<int> local_13b9;
  undefined1 local_13b8 [8];
  vector<int,_std::allocator<int>_> values;
  size_t size;
  mt19937 generator;
  UniversalTest_SingleUniversal_Test_Test *this_local;
  
  generator._M_p = (size_t)this;
  rVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&size,rVar4);
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xf4240;
  std::allocator<int>::allocator(&local_13b9);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_13b8,1000000,&local_13b9);
  std::allocator<int>::~allocator(&local_13b9);
  for (local_13d0 = 0; local_13d0 < 1000000; local_13d0 = local_13d0 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&size);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_13b8,(long)(int)local_13d0);
    *pvVar5 = (value_type)rVar4;
  }
  for (tested._28_4_ = 0; (int)tested._28_4_ < 3; tested._28_4_ = tested._28_4_ + 1) {
    HeapList::HeapList((HeapList *)&fool.super_HeapList.TYPE,tested._28_4_);
    FoolHeapList::FoolHeapList((FoolHeapList *)local_1418);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_13b8,0);
    HeapList::AddHeap((HeapList *)&fool.super_HeapList.TYPE,*pvVar5);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_13b8,0);
    HeapList::AddHeap((HeapList *)local_1418,*pvVar5);
    this_00 = std::operator<<((ostream *)&std::cout,"Size ");
    this_01 = (void *)std::ostream::operator<<(this_00,1000000);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    for (gtest_ar_.message_.ptr_._4_4_ = 0; gtest_ar_.message_.ptr_._4_4_ < 999999;
        gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_13b8,
                          (long)(int)(gtest_ar_.message_.ptr_._4_4_ + 1));
      HeapList::Insert((HeapList *)&fool.super_HeapList.TYPE,0,*pvVar5);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_13b8,
                          (long)(int)(gtest_ar_.message_.ptr_._4_4_ + 1));
      HeapList::Insert((HeapList *)local_1418,0,*pvVar5);
      iVar2 = HeapList::GetMin((HeapList *)&fool.super_HeapList.TYPE,0);
      iVar3 = HeapList::GetMin((HeapList *)local_1418,0);
      local_1431 = iVar2 == iVar3;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1430,&local_1431,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1430);
      if (!bVar1) {
        testing::Message::Message(&local_1440);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1468,(internal *)local_1430,
                   (AssertionResult *)"tested.GetMin(0) == fool.GetMin(0)","false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1448,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x1d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1448,&local_1440);
        testing::internal::AssertHelper::~AssertHelper(&local_1448);
        std::__cxx11::string::~string((string *)local_1468);
        testing::Message::~Message(&local_1440);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1430);
    }
    for (gtest_ar__1.message_.ptr_._4_4_ = 0; gtest_ar__1.message_.ptr_._4_4_ < 1000000;
        gtest_ar__1.message_.ptr_._4_4_ = gtest_ar__1.message_.ptr_._4_4_ + 1) {
      iVar2 = HeapList::ExtractMin((HeapList *)&fool.super_HeapList.TYPE,0);
      iVar3 = HeapList::ExtractMin((HeapList *)local_1418,0);
      local_1481 = iVar2 == iVar3;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1480,&local_1481,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1480);
      if (!bVar1) {
        testing::Message::Message(&local_1490);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_14b8,(internal *)local_1480,
                   (AssertionResult *)"tested.ExtractMin(0) == fool.ExtractMin(0)","false","true",
                   in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1498,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x21,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1498,&local_1490);
        testing::internal::AssertHelper::~AssertHelper(&local_1498);
        std::__cxx11::string::~string((string *)&local_14b8);
        testing::Message::~Message(&local_1490);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1480);
    }
    FoolHeapList::~FoolHeapList((FoolHeapList *)local_1418);
    HeapList::~HeapList((HeapList *)&fool.super_HeapList.TYPE);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_13b8);
  return;
}

Assistant:

TEST(UniversalTest, SingleUniversal_Test) {
    std::mt19937 generator(time(0));
    const size_t size = 1000000;
    std::vector<int> values(size);
    for (int i = 0; i < size; i++) {
        values[i] = generator();
    }

    for (int type = 0; type < 3; type++) {
        HeapList tested(type);
        FoolHeapList fool;

        tested.AddHeap(values[0]);
        fool.AddHeap(values[0]);
        std::cout << "Size " << size << std::endl;

        for (int i = 0; i < size - 1; i++) {
            tested.Insert(0, values[i + 1]);
            fool.Insert(0, values[i + 1]);
            EXPECT_TRUE(tested.GetMin(0) == fool.GetMin(0));
        }

        for (int i = 0; i < size; i++) {
            EXPECT_TRUE(tested.ExtractMin(0) == fool.ExtractMin(0));
        }
    }
}